

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::showEvent(QMdiSubWindow *this,QShowEvent *showEvent)

{
  int iVar1;
  QMdiSubWindowPrivate *this_00;
  Data *pDVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  QStyle *pQVar5;
  QProxyStyle *this_01;
  long lVar6;
  QSizeGrip *this_02;
  QMenuBar *this_03;
  QWidget *pQVar7;
  QWidget *pQVar8;
  Representation RVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidget::showEvent(&this->super_QWidget,showEvent);
      return;
    }
  }
  else {
    pQVar5 = QWidget::style(&this->super_QWidget);
    this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
    if (this_01 != (QProxyStyle *)0x0) {
      pQVar5 = QProxyStyle::baseStyle(this_01);
    }
    lVar6 = (**(code **)(*(long *)pQVar5 + 8))(pQVar5,"QMacStyle");
    if (((lVar6 != 0) &&
        (((pDVar2 = (this_00->sizeGrip).wp.d, pDVar2 == (Data *)0x0 || (*(int *)(pDVar2 + 4) == 0))
         || ((this_00->sizeGrip).wp.value == (QObject *)0x0)))) &&
       (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
      this_02 = (QSizeGrip *)operator_new(0x28);
      QSizeGrip::QSizeGrip(this_02,&this->super_QWidget);
      QMdiSubWindowPrivate::setSizeGrip(this_00,this_02);
      bVar4 = QWidget::isMinimized(&this->super_QWidget);
      QMdiSubWindowPrivate::setSizeGripVisible(this_00,!bVar4);
      pQVar3 = (this->super_QWidget).data;
      RVar9.m_i = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
      RVar10.m_i = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1;
      iVar1 = (this_00->internalMinimumSize).wd.m_i;
      if (RVar9.m_i <= iVar1) {
        RVar9.m_i = iVar1;
      }
      iVar1 = (this_00->internalMinimumSize).ht.m_i;
      if (RVar10.m_i <= iVar1) {
        RVar10.m_i = iVar1;
      }
      local_30.ht.m_i = RVar10.m_i;
      local_30.wd.m_i = RVar9.m_i;
      QWidget::resize(&this->super_QWidget,&local_30);
    }
    QMdiSubWindowPrivate::updateDirtyRegions(this_00);
    pDVar2 = (this_00->controlContainer).wp.d;
    if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
       ((this_00->controlContainer).wp.value != (QObject *)0x0)) {
      this_03 = QMdiSubWindowPrivate::menuBar(this_00);
      if (this_03 != (QMenuBar *)0x0) {
        pQVar7 = QMenuBar::cornerWidget(this_03,TopRightCorner);
        pQVar8 = maximizedButtonsWidget(this);
        if (pQVar7 != pQVar8) {
          QMdiSubWindowPrivate::showButtonsInMenuBar(this_00,this_03);
        }
      }
    }
    QMdiSubWindowPrivate::setActive(this_00,true,true);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiSubWindow);
    if (!parent()) {
        QWidget::showEvent(showEvent);
        return;
    }

#if QT_CONFIG(sizegrip)
    if (isMacStyle(style()) && !d->sizeGrip
            && !(windowFlags() & Qt::FramelessWindowHint)) {
        d->setSizeGrip(new QSizeGrip(this));
        Q_ASSERT(d->sizeGrip);
        if (isMinimized())
            d->setSizeGripVisible(false);
        else
            d->setSizeGripVisible(true);
        resize(size().expandedTo(d->internalMinimumSize));
    }
#endif

    d->updateDirtyRegions();
    // Show buttons in the menu bar if they're already not there.
    // We want to do this when QMdiSubWindow becomes visible after being hidden.
#if QT_CONFIG(menubar)
    if (d->controlContainer) {
        if (QMenuBar *menuBar = d->menuBar()) {
            if (menuBar->cornerWidget(Qt::TopRightCorner) != maximizedButtonsWidget())
                d->showButtonsInMenuBar(menuBar);
        }
    }
#endif
    d->setActive(true);
}